

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O2

int uninit(AP_CTX *ctx)

{
  int extraout_EAX;
  
  free(ctx->default_dir);
  free(ctx->config_path);
  if ((FILE *)ctx->config_file != (FILE *)0x0) {
    fclose((FILE *)ctx->config_file);
  }
  free(ctx->log_path);
  if ((FILE *)ctx->log_file != (FILE *)0x0) {
    fclose((FILE *)ctx->log_file);
  }
  free(ctx->client_ip);
  free(ctx->client_command);
  ctx->client_ip = (char *)0x0;
  ctx->client_command = (char *)0x0;
  ctx->log_file = (FILE *)0x0;
  *(undefined8 *)&ctx->simulate = 0;
  ctx->config_file = (FILE *)0x0;
  ctx->log_path = (char *)0x0;
  ctx->default_dir = (char *)0x0;
  ctx->config_path = (char *)0x0;
  return extraout_EAX;
}

Assistant:

static int uninit (AP_CTX *ctx)
{
	if (ctx->default_dir != NULL)
	{
		free (ctx->default_dir);
	}

	if (ctx->config_path != NULL)
	{
		free (ctx->config_path);
	}

	if (ctx->config_file != NULL)
	{
		fclose (ctx->config_file);
	}

	if (ctx->log_path != NULL)
	{
		free (ctx->log_path);
	}

	if (ctx->log_file != NULL)
	{
		fclose (ctx->log_file);
	}

	if (ctx->client_ip != NULL)
	{
		free (ctx->client_ip);
	}

	if (ctx->client_command != NULL)
	{
		free (ctx->client_command);
	}

	memset (ctx, 0, sizeof (AP_CTX));

	return AP_NO_ERROR;
}